

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cc
# Opt level: O2

int __thiscall
iqnet::Acceptor::accept(Acceptor *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  char cVar1;
  int extraout_EAX;
  Firewall_base *pFVar2;
  Socket new_sock;
  string msg;
  Socket local_50;
  char *local_28;
  size_t local_20;
  
  Socket::accept(&local_50,(int)this + 8,__addr,__addr_len);
  pFVar2 = this->firewall;
  if (pFVar2 != (Firewall_base *)0x0) {
    cVar1 = (**(code **)(*(long *)pFVar2 + 0x10))(pFVar2,&local_50.peer);
    if (cVar1 == '\0') {
      pFVar2 = this->firewall;
      (**(code **)(*(long *)pFVar2 + 0x18))(&local_28);
      if (local_20 == 0) {
        Socket::shutdown(&local_50,(int)pFVar2,0);
      }
      else {
        Socket::send_shutdown(&local_50,local_28,local_20);
      }
      std::__cxx11::string::~string((string *)&local_28);
      goto LAB_0015c6e3;
    }
  }
  (*this->factory->_vptr_Accepted_conn_factory[2])(this->factory,&local_50);
LAB_0015c6e3:
  Socket::~Socket(&local_50);
  return extraout_EAX;
}

Assistant:

void Acceptor::accept()
{
  Socket new_sock( sock.accept() );

  if( firewall && !firewall->grant( new_sock.get_peer_addr() ) )
  {
    std::string msg = firewall->message();

    if (!msg.empty())
    {
      new_sock.send_shutdown(msg.c_str(), msg.size());
    } else {
      new_sock.shutdown();
    }

    return;
  }

  factory->create_accepted( new_sock );
}